

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Field.cpp
# Opt level: O2

Vector3d * __thiscall
OpenMD::DipoleField::getValue(Vector3d *__return_storage_ptr__,DipoleField *this,StuntDouble *sd)

{
  AtomType *pAVar1;
  bool bVar2;
  ObjectType OVar3;
  _func_int **pp_Var4;
  Atom *this_00;
  RigidBody *rb;
  FixedChargeAdapter fca;
  FluctuatingChargeAdapter fqa;
  Vector3d pos;
  double local_90;
  FixedChargeAdapter local_88;
  FluctuatingChargeAdapter local_80;
  Vector<double,_3U> local_78;
  Vector<double,_3U> local_60;
  Vector<double,_3U> local_48;
  
  local_60.data_[0] = 0.0;
  Vector<double,_3U>::Vector(&local_78,local_60.data_);
  Vector<double,_3U>::Vector(&__return_storage_ptr__->super_Vector<double,_3U>,&local_78);
  OVar3 = sd->objType_;
  if (OVar3 == otDAtom) {
    StuntDouble::getDipole((Vector3d *)&local_78,sd);
    Vector<double,_3U>::add(&__return_storage_ptr__->super_Vector<double,_3U>,&local_78);
    OVar3 = sd->objType_;
  }
  if (OVar3 == otRigidBody) {
    pp_Var4 = (_func_int **)sd[2].mass_;
    if (pp_Var4 != sd[2].properties_._vptr_PropertyMap) goto LAB_00141859;
    this_00 = (Atom *)0x0;
    do {
      do {
        if (this_00 == (Atom *)0x0) {
          return __return_storage_ptr__;
        }
        pAVar1 = this_00->atomType_;
        local_88.at_ = pAVar1;
        bVar2 = FixedChargeAdapter::isFixedCharge(&local_88);
        local_90 = 0.0;
        if (bVar2) {
          local_90 = FixedChargeAdapter::getCharge(&local_88);
        }
        local_80.at_ = pAVar1;
        bVar2 = FluctuatingChargeAdapter::isFluctuatingCharge(&local_80);
        if (bVar2) {
          local_90 = local_90 +
                     *(double *)
                      (*(long *)((long)&(((this_00->super_StuntDouble).snapshotMan_)->
                                         currentSnapshot_->atomData).flucQPos.
                                        super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                        super__Vector_impl_data._M_start +
                                (this_00->super_StuntDouble).storage_) +
                      (long)(this_00->super_StuntDouble).localIndex_ * 8);
        }
        StuntDouble::getPos((Vector3d *)&local_78,&this_00->super_StuntDouble);
        operator*(&local_48,&local_78,local_90);
        operator*(&local_60,&local_48,4.8032045444);
        Vector<double,_3U>::add(&__return_storage_ptr__->super_Vector<double,_3U>,&local_60);
        bVar2 = Atom::isDipole(this_00);
        if (bVar2) {
          StuntDouble::getDipole((Vector3d *)&local_60,&this_00->super_StuntDouble);
          Vector<double,_3U>::add(&__return_storage_ptr__->super_Vector<double,_3U>,&local_60);
        }
        pp_Var4 = pp_Var4 + 1;
        this_00 = (Atom *)0x0;
      } while (pp_Var4 == sd[2].properties_._vptr_PropertyMap);
LAB_00141859:
      this_00 = (Atom *)*pp_Var4;
    } while( true );
  }
  return __return_storage_ptr__;
}

Assistant:

Vector3d DipoleField::getValue(StuntDouble* sd) {
    const RealType eAtoDebye = 4.8032045444;
    Vector3d dipoleVector(0.0);

    if (sd->isDirectionalAtom()) {
      dipoleVector += static_cast<DirectionalAtom*>(sd)->getDipole();
    }

    if (sd->isRigidBody()) {
      RigidBody* rb = static_cast<RigidBody*>(sd);
      Atom* atom;
      RigidBody::AtomIterator ai;
      for (atom = rb->beginAtom(ai); atom != NULL; atom = rb->nextAtom(ai)) {
        RealType charge(0.0);
        AtomType* atomType = atom->getAtomType();

        FixedChargeAdapter fca = FixedChargeAdapter(atomType);
        if (fca.isFixedCharge()) { charge = fca.getCharge(); }

        FluctuatingChargeAdapter fqa = FluctuatingChargeAdapter(atomType);
        if (fqa.isFluctuatingCharge()) { charge += atom->getFlucQPos(); }

        Vector3d pos = atom->getPos();
        dipoleVector += pos * charge * eAtoDebye;

        if (atom->isDipole()) { dipoleVector += atom->getDipole(); }
      }
    }
    return dipoleVector;
  }